

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST_Parser.cpp
# Opt level: O3

shared_ptr<nigel::AstReturning> __thiscall
nigel::AST_Parser::splitMostRightExpr
          (AST_Parser *this,shared_ptr<nigel::AstExpr> *currLVal,
          shared_ptr<nigel::AstComparisonCondition> *cExpr,int priority)

{
  map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
  *this_00;
  int iVar1;
  AST_Parser *pAVar2;
  _func_int **pp_Var3;
  mapped_type *pmVar4;
  undefined4 in_register_0000000c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Type TVar6;
  element_type *peVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  int in_R8D;
  _func_int **pp_Var8;
  bool bVar9;
  shared_ptr<nigel::AstReturning> sVar10;
  element_type *local_a0;
  undefined1 local_98 [36];
  key_type local_74;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  BuilderExecutable *local_68;
  _func_int **local_60;
  shared_ptr<nigel::Token> local_58;
  AST_Parser *local_48;
  _func_int **local_40;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  
  local_70._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(in_register_0000000c,priority);
  this_00 = (map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
             *)(currLVal + 2);
  local_98._24_8_ =
       &(cExpr->super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>).
        _M_refcount;
  pp_Var8 = (_func_int **)0x0;
  local_a0 = (element_type *)0x0;
  local_68 = (BuilderExecutable *)currLVal;
  pp_Var3 = pp_Var8;
  local_48 = this;
  do {
    while( true ) {
      local_60 = pp_Var3;
      TVar6 = (((cExpr->
                super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->super_AstCondition).super_AstExpr.type;
      if (TVar6 != combinationCondition) break;
      AstExpr::as<nigel::AstCombinationCondition>((AstExpr *)local_98);
      pmVar4 = std::
               map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
               ::operator[](this_00,(key_type *)(local_98._0_8_ + 0x50));
      iVar1 = *pmVar4;
      if ((element_type *)local_98._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
      }
      if (in_R8D <= iVar1) {
        TVar6 = (((cExpr->
                  super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->super_AstCondition).super_AstExpr.type;
        break;
      }
      AstExpr::as<nigel::AstCombinationCondition>((AstExpr *)local_98);
      peVar7 = (element_type *)local_98._8_8_;
      pp_Var8 = (_func_int **)local_98._0_8_;
      local_98._0_8_ = (_func_int **)0x0;
      local_98._8_8_ = (element_type *)0x0;
      if ((local_a0 != (element_type *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0),
         (element_type *)local_98._8_8_ != (element_type *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
      }
      AstExpr::as<nigel::AstCombinationCondition>((AstExpr *)local_98);
LAB_00137847:
      (cExpr->super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
           = *(element_type **)(local_98._0_8_ + 0x40);
      __r = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98._0_8_ + 0x48);
LAB_00137857:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_98._24_8_,__r);
      pp_Var3 = pp_Var8;
      local_a0 = peVar7;
      if ((element_type *)local_98._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
      }
    }
    if (TVar6 == comparisonCondition) {
      AstExpr::as<nigel::AstComparisonCondition>((AstExpr *)local_98);
      pmVar4 = std::
               map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
               ::operator[](this_00,(key_type *)(local_98._0_8_ + 0x50));
      iVar1 = *pmVar4;
      if ((element_type *)local_98._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
      }
      if (iVar1 < in_R8D) {
        AstExpr::as<nigel::AstComparisonCondition>((AstExpr *)local_98);
        peVar7 = (element_type *)local_98._8_8_;
        pp_Var8 = (_func_int **)local_98._0_8_;
        local_98._0_8_ = (_func_int **)0x0;
        local_98._8_8_ = (element_type *)0x0;
        if ((local_a0 != (element_type *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0),
           (element_type *)local_98._8_8_ != (element_type *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
        }
        AstExpr::as<nigel::AstComparisonCondition>((AstExpr *)local_98);
        goto LAB_00137847;
      }
      TVar6 = (((cExpr->
                super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->super_AstCondition).super_AstExpr.type;
    }
    if (TVar6 != term) {
LAB_00137693:
      local_74 = op_set;
      pmVar4 = std::
               map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
               ::operator[](this_00,&local_74);
      if (*pmVar4 != in_R8D) {
        if (TVar6 == term) {
          bVar9 = false;
          goto LAB_001376ff;
        }
        goto LAB_0013771d;
      }
      AstExpr::as<nigel::AstTerm>((AstExpr *)local_98);
      pmVar4 = std::
               map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
               ::operator[](this_00,(key_type *)(local_98._0_8_ + 0x58));
      iVar1 = *pmVar4;
      bVar9 = iVar1 == in_R8D;
      if ((element_type *)local_98._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
      }
      if (TVar6 == term) goto LAB_001376ff;
      pp_Var8 = local_60;
      if (iVar1 != in_R8D) goto LAB_0013771d;
LAB_00137764:
      AstExpr::as<nigel::AstTerm>((AstExpr *)local_98);
      peVar7 = (element_type *)local_98._8_8_;
      pp_Var8 = (_func_int **)local_98._0_8_;
      local_98._0_8_ = (_func_int **)0x0;
      local_98._8_8_ = (element_type *)0x0;
      if ((local_a0 != (element_type *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0),
         (element_type *)local_98._8_8_ != (element_type *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
      }
      AstExpr::as<nigel::AstTerm>((AstExpr *)local_98);
      (cExpr->super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
           = *(element_type **)(local_98._0_8_ + 0x48);
      __r = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98._0_8_ + 0x50);
      goto LAB_00137857;
    }
    AstExpr::as<nigel::AstTerm>((AstExpr *)&local_40);
    pmVar4 = std::
             map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
             ::operator[](this_00,(key_type *)(local_40 + 0xb));
    if (in_R8D <= *pmVar4) goto LAB_00137693;
    bVar9 = true;
LAB_001376ff:
    if (local_38 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
    }
    pp_Var8 = local_60;
    if (bVar9) goto LAB_00137764;
LAB_0013771d:
    if ((((cExpr->super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr)->super_AstCondition).super_AstExpr.type != arithmenticCondition) {
      if (pp_Var8 == (_func_int **)0x0) {
        local_68[5].notificationList.
        super__List_base<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
        ._M_impl._M_node.super__List_node_base._M_prev =
             (_List_node_base *)(local_70._M_pi)->_vptr__Sp_counted_base;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_68[5].notificationList.
                    super__List_base<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
                    ._M_impl._M_node._M_size,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(local_70._M_pi)->_M_use_count);
      }
      else {
        if (*(int *)(pp_Var8 + 3) == 0xe) {
          AstExpr::as<nigel::AstCombinationCondition>((AstExpr *)local_98);
          *(_func_int ***)(local_98._0_8_ + 0x40) = (local_70._M_pi)->_vptr__Sp_counted_base;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98._0_8_ + 0x48),
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(local_70._M_pi)->_M_use_count);
          _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_;
        }
        else {
          local_58.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)pp_Var8[4];
          local_58.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pp_Var8[5];
          if ((element_type *)
              local_58.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&(((element_type *)
                        local_58.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->super_enable_shared_from_this<nigel::AstExpr>).
                       _M_weak_this.super___weak_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr =
                   *(int *)&(((element_type *)
                             local_58.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->super_enable_shared_from_this<nigel::AstExpr>).
                            _M_weak_this.
                            super___weak_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
              UNLOCK();
            }
            else {
              *(int *)&(((element_type *)
                        local_58.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->super_enable_shared_from_this<nigel::AstExpr>).
                       _M_weak_this.super___weak_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr =
                   *(int *)&(((element_type *)
                             local_58.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->super_enable_shared_from_this<nigel::AstExpr>).
                            _M_weak_this.
                            super___weak_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
            }
          }
          BuilderExecutable::generateNotification
                    (local_68,err_comparisonConditionCannotBeThisRValue,&local_58);
          _Var5._M_pi = local_58.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
        }
        if ((element_type *)_Var5._M_pi != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi);
        }
      }
      pAVar2 = local_48;
      sVar10 = AstExpr::as<nigel::AstReturning>((AstExpr *)local_48);
      _Var5 = sVar10.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi;
      if (local_a0 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0);
        _Var5._M_pi = extraout_RDX;
      }
      sVar10.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var5._M_pi;
      sVar10.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)pAVar2;
      return (shared_ptr<nigel::AstReturning>)
             sVar10.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>;
    }
    AstExpr::as<nigel::AstArithmeticCondition>((AstExpr *)local_98);
    (cExpr->super___shared_ptr<nigel::AstComparisonCondition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         *(element_type **)(local_98._0_8_ + 0x30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_98._24_8_,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98._0_8_ + 0x38));
    pp_Var3 = local_60;
    if ((element_type *)local_98._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
      pp_Var3 = local_60;
    }
  } while( true );
}

Assistant:

std::shared_ptr<AstReturning> AST_Parser::splitMostRightExpr( std::shared_ptr<AstExpr> currLVal, std::shared_ptr<AstComparisonCondition> cExpr, int priority )
	{
		//Check if lValue is a term
		std::shared_ptr<AstExpr> clTerm = nullptr;
		while( true )
		{//Split all possible (unatomic) expressions
			if( currLVal->type == AstExpr::Type::combinationCondition && opPriority[currLVal->as<AstCombinationCondition>()->op] < priority )
			{
				clTerm = currLVal->as<AstCombinationCondition>();
				currLVal = currLVal->as<AstCombinationCondition>()->rVal;
			}
			else if( currLVal->type == AstExpr::Type::comparisonCondition && opPriority[currLVal->as<AstComparisonCondition>()->op] < priority )
			{
				clTerm = currLVal->as<AstComparisonCondition>();
				currLVal = currLVal->as<AstComparisonCondition>()->rVal;
			}
			else if( ( currLVal->type == AstExpr::Type::term && opPriority[currLVal->as<AstTerm>()->op] < priority ) ||
				( priority == opPriority[TT::op_set] && opPriority[currLVal->as<AstTerm>()->op] == priority ) )
			{
				clTerm = currLVal->as<AstTerm>();
				currLVal = currLVal->as<AstTerm>()->rVal;
			}
			else if( currLVal->type == AstExpr::Type::arithmenticCondition )
			{
				currLVal = currLVal->as<AstArithmeticCondition>()->ret;
			}
			else break;
		}

		//Test for lTerm
		if( clTerm != nullptr )
		{//Min. 1 term was splitted up
			if( clTerm->type == AstExpr::Type::combinationCondition ) clTerm->as<AstCombinationCondition>()->rVal = cExpr;
			else generateNotification( NT::err_comparisonConditionCannotBeThisRValue, clTerm->token );
			return currLVal->as<AstReturning>();
		}
		else
		{//LValue is a atomic astExpr
			lValue = cExpr;//Set as lValue
			return currLVal->as<AstReturning>();
		}
	}